

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

int mbedtls_ssl_update_handshake_status(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_handshake_params *ssl_00;
  int ret;
  
  pmVar1 = ssl->handshake;
  if ((pmVar1 != (mbedtls_ssl_handshake_params *)0x0 && ssl->state < 0x1b) &&
     (ret = (*pmVar1->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen), ret != 0)) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xcfb,"update_checksum",ret);
    return ret;
  }
  if ((ssl->conf->transport == '\x01') &&
     (ssl_00 = ssl->handshake, ssl_00 != (mbedtls_ssl_handshake_params *)0x0)) {
    pmVar1->in_msg_seq = pmVar1->in_msg_seq + 1;
    ssl_buffering_free_slot((mbedtls_ssl_context *)ssl_00,'\0');
    memmove((pmVar1->buffering).hs,(pmVar1->buffering).hs + 1,0x48);
    *(undefined8 *)((pmVar1->buffering).hs + 3) = 0;
    (pmVar1->buffering).hs[3].data = (uchar *)0x0;
    (pmVar1->buffering).hs[3].data_len = 0;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_update_handshake_status(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;

    if (mbedtls_ssl_is_handshake_over(ssl) == 0 && hs != NULL) {
        ret = ssl->handshake->update_checksum(ssl, ssl->in_msg, ssl->in_hslen);
        if (ret != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "update_checksum", ret);
            return ret;
        }
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL) {
        unsigned offset;
        mbedtls_ssl_hs_buffer *hs_buf;

        /* Increment handshake sequence number */
        hs->in_msg_seq++;

        /*
         * Clear up handshake buffering and reassembly structure.
         */

        /* Free first entry */
        ssl_buffering_free_slot(ssl, 0);

        /* Shift all other entries */
        for (offset = 0, hs_buf = &hs->buffering.hs[0];
             offset + 1 < MBEDTLS_SSL_MAX_BUFFERED_HS;
             offset++, hs_buf++) {
            *hs_buf = *(hs_buf + 1);
        }

        /* Create a fresh last entry */
        memset(hs_buf, 0, sizeof(mbedtls_ssl_hs_buffer));
    }
#endif
    return 0;
}